

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_wraith.cpp
# Opt level: O1

int AF_A_WraithFX3(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *pAVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined8 uVar10;
  PClass *pPVar11;
  PClassActor *type;
  AActor *pAVar12;
  VMValue *pVVar13;
  char *__assertion;
  bool bVar14;
  DVector2 v;
  FName local_58;
  undefined4 uStack_54;
  double dStack_50;
  DVector3 local_48;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005c4598;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    pAVar2 = (AActor *)(param->field_0).field_1.a;
    pVVar13 = param;
    uVar6 = numparam;
    if (pAVar2 != (AActor *)0x0) {
      if ((pAVar2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(pAVar2->super_DThinker).super_DObject._vptr_DObject)(pAVar2);
        (pAVar2->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar11 = (pAVar2->super_DThinker).super_DObject.Class;
      bVar14 = pPVar11 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar14;
      uVar6 = (uint)bVar14;
      pVVar13 = (VMValue *)(ulong)(pPVar11 == pPVar4 || bVar14);
      if (pPVar11 != pPVar4 && !bVar14) {
        do {
          pPVar11 = pPVar11->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar11 != (PClass *)0x0);
          if (pPVar11 == pPVar4) break;
        } while (pPVar11 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005c4598;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005c456d;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar10 = (**(code **)*puVar3)(puVar3,pVVar13,uVar6,ret);
          puVar3[1] = uVar10;
        }
        pPVar11 = (PClass *)puVar3[1];
        bVar14 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar4 && bVar14) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar14 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar4) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        if (!bVar14) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c4598;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      uVar6 = FRandom::GenRand32(&pr_wraithfx3);
      if (0x11111111 < (uVar6 & 0xff) * -0x11111111) {
        iVar5 = (uVar6 & 0xff) % 0xf + 1;
        do {
          uVar6 = FRandom::GenRand32(&pr_wraithfx3);
          uVar7 = FRandom::GenRand32(&pr_wraithfx3);
          uVar8 = FRandom::GenRand32(&pr_wraithfx3);
          iVar9 = FName::NameManager::FindName(&FName::NameData,"WraithFX3",false);
          P_GetOffsetPosition((pAVar2->__Pos).X,(pAVar2->__Pos).Y,
                              (double)(int)((uVar6 & 0xff) - 0x80) * 0.03125,
                              (double)(int)((uVar7 & 0xff) - 0x80) * 0.03125);
          local_48.Z = (double)(uVar8 & 0xff) * 0.015625 + (pAVar2->__Pos).Z;
          local_48.X = (double)CONCAT44(uStack_54,local_58.Index);
          local_48.Y = dStack_50;
          local_58.Index = iVar9;
          type = ClassForSpawn(&local_58);
          pAVar12 = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
          if (pAVar12 != (AActor *)0x0) {
            pAVar12->floorz = pAVar2->floorz;
            pAVar12->ceilingz = pAVar2->ceilingz;
            (pAVar12->target).field_0.p = pAVar2;
          }
          iVar5 = iVar5 + -1;
        } while (1 < iVar5);
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005c456d:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005c4598:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                ,0x96,"int AF_A_WraithFX3(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WraithFX3)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	int numdropped = pr_wraithfx3() % 15;

	while (numdropped-- > 0)
	{
		double xo = (pr_wraithfx3() - 128) / 32.;
		double yo = (pr_wraithfx3() - 128) / 32.;
		double zo = pr_wraithfx3() / 64.;

		mo = Spawn("WraithFX3", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->floorz = self->floorz;
			mo->ceilingz = self->ceilingz;
			mo->target = self;
		}
	}
	return 0;
}